

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

uint32_t __thiscall cppnet::BufferBlock::GetCanReadLength(BufferBlock *this)

{
  BufferBlock *this_local;
  
  if (this->_read < this->_write) {
    this_local._4_4_ = (int)this->_write - (int)this->_read;
  }
  else if (this->_write < this->_read) {
    this_local._4_4_ =
         ((int)this->_buffer_end - (int)this->_read) +
         ((int)this->_write - (int)this->_buffer_start);
  }
  else if ((this->_can_read & 1U) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = this->_total_size;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferBlock::GetCanReadLength() {
    if (_write > _read) {
        return (uint32_t)(_write - _read);

    } else if (_write < _read) {
        return (uint32_t)((_buffer_end - _read) + (_write - _buffer_start));

    } else {
        if (_can_read) {
            return _total_size;

        } else {
            return 0;
        }
    }
}